

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_py_generator.cc
# Opt level: O3

void __thiscall
t_py_generator::generate_deserialize_struct
          (t_py_generator *this,ostream *out,t_struct *tstruct,string *prefix)

{
  bool bVar1;
  ostream *poVar2;
  string local_88;
  string local_68;
  string local_48;
  
  bVar1 = is_immutable(&tstruct->super_t_type);
  if (bVar1) {
    t_generator::indent_abi_cxx11_(&local_68,&this->super_t_generator);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_68._M_dataplus._M_p,local_68._M_string_length);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," = ",3);
    type_name_abi_cxx11_(&local_88,this,&tstruct->super_t_type);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_88._M_dataplus._M_p,local_88._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,".read(iprot)",0xc);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  else {
    t_generator::indent_abi_cxx11_(&local_68,&this->super_t_generator);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_68._M_dataplus._M_p,local_68._M_string_length);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," = ",3);
    type_name_abi_cxx11_(&local_88,this,&tstruct->super_t_type);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_88._M_dataplus._M_p,local_88._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"()",2);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_48,&this->super_t_generator);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_48._M_dataplus._M_p,local_48._M_string_length);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,".read(iprot)",0xc);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_py_generator::generate_deserialize_struct(ostream& out, t_struct* tstruct, string prefix) {
  if (is_immutable(tstruct)) {
    out << indent() << prefix << " = " << type_name(tstruct) << ".read(iprot)" << endl;
  } else {
    out << indent() << prefix << " = " << type_name(tstruct) << "()" << endl
        << indent() << prefix << ".read(iprot)" << endl;
  }
}